

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

void __thiscall libcellml::Logger::LoggerImpl::removeError(LoggerImpl *this,size_t index)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer puVar3;
  Level LVar4;
  pointer __src;
  iterator __position;
  char *this_00;
  unsigned_long uStack_30;
  
  puVar2 = (this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->mErrors).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
    std::
    vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>::
    _M_erase(&this->mIssues,
             (this->mIssues).
             super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
             ._M_impl.super__Vector_impl_data._M_start + puVar2[index]);
    puVar2 = (this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    __src = puVar2 + index + 1;
    if (__src != puVar3) {
      memmove(puVar2 + index,__src,(long)puVar3 - (long)__src);
    }
    ppuVar1 = &(this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
    return;
  }
  this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  uStack_30 = *(long *)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x50) -
              *(long *)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x48) >> 4;
  std::
  vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>::
  push_back((vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
             *)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x48),
            (value_type *)index);
  LVar4 = Issue::level((((value_type *)index)->
                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (LVar4 == WARNING) {
    __position._M_current =
         *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x20);
    if (__position._M_current !=
        *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x28))
    {
      *__position._M_current = uStack_30;
      *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x20) =
           __position._M_current + 1;
      return;
    }
    this_00 = (char *)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x18);
  }
  else if (LVar4 == ERROR) {
    __position._M_current =
         *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 8);
    if (__position._M_current !=
        *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x10))
    {
      *__position._M_current = uStack_30;
      *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 8) =
           __position._M_current + 1;
      return;
    }
  }
  else {
    __position._M_current =
         *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x38);
    if (__position._M_current !=
        *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x40))
    {
      *__position._M_current = uStack_30;
      *(unsigned_long **)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x38) =
           __position._M_current + 1;
      return;
    }
    this_00 = (char *)((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00 + 0x30);
  }
  std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long_const&>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,__position,&uStack_30);
  return;
}

Assistant:

void Logger::LoggerImpl::removeError(size_t index)
{
    mIssues.erase(mIssues.begin() + ptrdiff_t(mErrors.at(index)));
    mErrors.erase(mErrors.begin() + ptrdiff_t(index));
}